

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

void notdirty_write(CPUState *cpu,vaddr mem_vaddr,uint size,CPUIOTLBEntry *iotlbentry,
                   uintptr_t retaddr)

{
  page_collection *pages;
  tb_page_addr_t start;
  
  start = mem_vaddr + iotlbentry->addr;
  pages = page_collection_lock_tricore((uc_struct_conflict15 *)cpu->uc,start,size + start);
  tb_invalidate_phys_page_fast_tricore((uc_struct_conflict15 *)cpu->uc,pages,start,size,retaddr);
  page_collection_unlock_tricore(pages);
  return;
}

Assistant:

static void notdirty_write(CPUState *cpu, vaddr mem_vaddr, unsigned size,
                           CPUIOTLBEntry *iotlbentry, uintptr_t retaddr)
{
    ram_addr_t ram_addr = mem_vaddr + iotlbentry->addr;

    // trace_memory_notdirty_write_access(mem_vaddr, ram_addr, size);

    if (!cpu_physical_memory_get_dirty_flag(ram_addr, DIRTY_MEMORY_CODE)) {
        struct page_collection *pages
            = page_collection_lock(cpu->uc, ram_addr, ram_addr + size);
        tb_invalidate_phys_page_fast(cpu->uc, pages, ram_addr, size, retaddr);
        page_collection_unlock(pages);
    }

    /*
     * Set both VGA and migration bits for simplicity and to remove
     * the notdirty callback faster.
     */
    cpu_physical_memory_set_dirty_range(ram_addr, size, DIRTY_CLIENTS_NOCODE);

    /* We remove the notdirty callback only if the code has been flushed. */
    if (!cpu_physical_memory_is_clean(ram_addr)) {
        // trace_memory_notdirty_set_dirty(mem_vaddr);
        tlb_set_dirty(cpu, mem_vaddr);
    }
}